

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_constant_wnaf(secp256k1_scalar *number,int w)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ulong uVar35;
  secp256k1_scratch_space *scratch;
  long lVar36;
  ulong uVar37;
  code *pcVar38;
  byte bVar39;
  secp256k1_scalar *psVar40;
  secp256k1_scalar *psVar41;
  uint extraout_EDX;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long extraout_RDX;
  secp256k1_scratch *scratch_00;
  size_t sVar47;
  secp256k1_gej *r;
  ulong unaff_RBP;
  secp256k1_strauss_point_state *psVar48;
  secp256k1_scalar *psVar49;
  int iVar50;
  secp256k1_gej *psVar51;
  secp256k1_scratch *scratch_01;
  secp256k1_gej *psVar52;
  secp256k1_sha256 *hash;
  secp256k1_ge *psVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  code *cb;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  secp256k1_fe *unaff_R12;
  secp256k1_fe *psVar65;
  secp256k1_sha256 *acc;
  secp256k1_ge *unaff_R13;
  secp256k1_scalar *a;
  uint uVar66;
  uint64_t unaff_R15;
  secp256k1_gej *psVar67;
  bool bVar68;
  secp256k1_scalar t;
  secp256k1_scalar shift;
  secp256k1_scalar scalar_skew;
  int wnaf [256];
  ulong uStack_2918;
  secp256k1_strauss_state sStack_2910;
  secp256k1_strauss_point_state sStack_28f8;
  secp256k1_fe asStack_24e8 [8];
  secp256k1_ge asStack_2368 [8];
  size_t *psStack_2020;
  secp256k1_gej *psStack_2018;
  secp256k1_scalar *psStack_2010;
  secp256k1_sha256 *psStack_2008;
  secp256k1_gej *psStack_2000;
  secp256k1_strauss_point_state *psStack_1ff8;
  size_t sStack_1fe8;
  size_t sStack_1fd8;
  secp256k1_scratch asStack_1fd0 [2];
  secp256k1_scalar sStack_1f80;
  secp256k1_ge sStack_1f60;
  secp256k1_gej sStack_1ef8;
  secp256k1_gej sStack_1e60;
  secp256k1_gej sStack_1dc8;
  secp256k1_gej sStack_1d30;
  secp256k1_gej sStack_1c98;
  secp256k1_gej asStack_1c00 [2];
  secp256k1_gej asStack_1a80 [5];
  secp256k1_strauss_point_state sStack_1740;
  secp256k1_scratch_space *psStack_1328;
  secp256k1_sha256 *psStack_1320;
  secp256k1_scalar *psStack_1318;
  secp256k1_gej *psStack_1310;
  secp256k1_gej *psStack_1308;
  secp256k1_scalar *psStack_1300;
  undefined4 uStack_12ee;
  undefined2 uStack_12ea;
  secp256k1_gej *psStack_12e8;
  long lStack_12e0;
  secp256k1_scalar sStack_12d8;
  secp256k1_scalar sStack_12b8;
  secp256k1_sha256 sStack_1298;
  secp256k1_sha256 sStack_1228;
  secp256k1_gej *psStack_11c0;
  secp256k1_fe *psStack_11b8;
  secp256k1_ge *psStack_11b0;
  secp256k1_ge *psStack_11a8;
  secp256k1_gej *psStack_11a0;
  secp256k1_strauss_point_state *psStack_1198;
  undefined1 auStack_1190 [32];
  undefined1 auStack_1170 [40];
  secp256k1_ge *psStack_1148;
  secp256k1_strauss_point_state *psStack_1140;
  secp256k1_gej sStack_1138;
  secp256k1_gej sStack_10a0;
  secp256k1_gej sStack_1008;
  secp256k1_ge sStack_f70;
  secp256k1_gej sStack_f08;
  secp256k1_fe asStack_e70 [8];
  secp256k1_ge asStack_cf0 [8];
  secp256k1_strauss_point_state sStack_9b0;
  secp256k1_scalar *psStack_598;
  secp256k1_fe *psStack_590;
  secp256k1_ge *psStack_588;
  ulong uStack_580;
  ulong uStack_578;
  code *pcStack_570;
  code *pcStack_568;
  int iStack_560;
  uint uStack_55c;
  uint uStack_558;
  int iStack_554;
  secp256k1_scalar *psStack_550;
  secp256k1_scalar *psStack_548;
  secp256k1_fe *psStack_540;
  secp256k1_ge *psStack_538;
  secp256k1_scalar *psStack_530;
  ulong uStack_528;
  code *pcStack_520;
  uint local_518;
  int local_514;
  ulong local_510;
  secp256k1_scalar local_508;
  secp256k1_scalar local_4e8;
  ulong local_4c0;
  secp256k1_scalar local_4b8;
  ulong local_498;
  secp256k1_fe *local_490;
  secp256k1_ge *psStack_488;
  ulong local_480;
  secp256k1_scalar local_478;
  long local_458;
  long local_450;
  undefined1 local_448 [16];
  secp256k1_scalar local_438 [32];
  
  pcStack_520 = (code *)0x1589b4;
  memset(local_438,0,0x400);
  local_508.d[0] = number->d[0];
  local_508.d[2] = number->d[2];
  local_508.d[3] = number->d[3];
  local_510 = (ulong)(uint)(1 << ((byte)w & 0x1f));
  local_4e8.d[0] = 0;
  local_4e8.d[1] = 0;
  local_4e8.d[2] = 0;
  local_4e8.d[3] = 0;
  local_490 = (secp256k1_fe *)0x0;
  psStack_488 = (secp256k1_ge *)0x0;
  local_480 = 0;
  iVar50 = 0x10;
  local_508.d[1] = number->d[1];
  do {
    uVar37 = local_508.d[1];
    local_508.d[0] = local_508.d[0] >> 8 | uVar37 << 0x38;
    local_508.d[1] = uVar37 >> 8 | local_508.d[2] << 0x38;
    local_508.d[2] = local_508.d[2] >> 8 | local_508.d[3] << 0x38;
    local_508.d[3] = local_508.d[3] >> 8;
    iVar50 = iVar50 + -1;
  } while (iVar50 != 0);
  psVar49 = &local_508;
  psVar40 = local_438;
  pcStack_520 = (code *)0x158a51;
  local_498 = local_510;
  local_518 = secp256k1_wnaf_const((int *)psVar40,psVar49,w,(int)(uVar37 >> 8));
  uVar37 = (long)(w + 0x7f) / (long)w;
  if (-1 < (int)uVar37) {
    uVar37 = uVar37 & 0xffffffff;
    local_514 = -(int)local_510;
    psVar65 = unaff_R12;
    psVar53 = unaff_R13;
    uVar35 = unaff_R15;
    do {
      unaff_R13 = psStack_488;
      unaff_R12 = local_490;
      unaff_R15 = local_4e8.d[3];
      psVar41 = &local_4e8;
      uVar66 = *(uint *)((long)local_438[0].d + uVar37 * 4);
      unaff_RBP = (ulong)uVar66;
      if (unaff_RBP == 0) {
        pcStack_520 = (code *)0x158cec;
        test_constant_wnaf_cold_5();
LAB_00158cec:
        pcStack_520 = (code *)0x158cf1;
        test_constant_wnaf_cold_4();
LAB_00158cf1:
        pcStack_520 = (code *)0x158cf6;
        test_constant_wnaf_cold_1();
LAB_00158cf6:
        pcStack_520 = (code *)0x158cfb;
        test_constant_wnaf_cold_2();
        goto LAB_00158cfb;
      }
      if ((uVar66 & 1) == 0) goto LAB_00158cec;
      if ((int)uVar66 <= local_514) goto LAB_00158cf1;
      if ((int)local_510 <= (int)uVar66) goto LAB_00158cf6;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_4e8.d[0];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_498;
      uVar42 = SUB168(auVar2 * auVar18,8);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar42;
      local_478.d[0] = SUB168(auVar2 * auVar18,0);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_4e8.d[0];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_490;
      auVar3 = auVar3 * auVar19;
      uVar54 = SUB168(auVar3 + auVar34,0);
      uVar59 = SUB168(auVar3 + auVar34,8);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_4e8.d[1];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_498;
      uVar43 = SUB168(auVar4 * auVar20,8);
      uVar35 = SUB168(auVar4 * auVar20,0);
      local_478.d[1] = uVar54 + uVar35;
      uVar35 = (ulong)CARRY8(uVar54,uVar35);
      uVar54 = uVar59 + uVar43;
      uVar60 = uVar54 + uVar35;
      uVar61 = (ulong)CARRY8(auVar3._8_8_,(ulong)CARRY8(uVar42,auVar3._0_8_)) +
               (ulong)(CARRY8(uVar59,uVar43) || CARRY8(uVar54,uVar35));
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_4e8.d[0];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = psStack_488;
      uVar44 = SUB168(auVar5 * auVar21,8);
      uVar35 = SUB168(auVar5 * auVar21,0);
      uVar42 = uVar60 + uVar35;
      uVar35 = (ulong)CARRY8(uVar60,uVar35);
      uVar43 = uVar61 + uVar44;
      uVar62 = uVar43 + uVar35;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_4e8.d[1];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_490;
      uVar45 = SUB168(auVar6 * auVar22,8);
      uVar54 = SUB168(auVar6 * auVar22,0);
      uVar60 = uVar42 + uVar54;
      uVar54 = (ulong)CARRY8(uVar42,uVar54);
      uVar59 = uVar62 + uVar45;
      uVar63 = uVar59 + uVar54;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_4e8.d[2];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_498;
      uVar46 = SUB168(auVar7 * auVar23,8);
      uVar42 = SUB168(auVar7 * auVar23,0);
      local_478.d[2] = uVar60 + uVar42;
      uVar42 = (ulong)CARRY8(uVar60,uVar42);
      uVar60 = uVar63 + uVar46;
      uVar64 = uVar60 + uVar42;
      uVar55 = (ulong)(CARRY8(uVar61,uVar44) || CARRY8(uVar43,uVar35)) +
               (ulong)(CARRY8(uVar62,uVar45) || CARRY8(uVar59,uVar54)) +
               (ulong)(CARRY8(uVar63,uVar46) || CARRY8(uVar60,uVar42));
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_4e8.d[0];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_480;
      uVar46 = SUB168(auVar8 * auVar24,8);
      uVar35 = SUB168(auVar8 * auVar24,0);
      uVar42 = uVar64 + uVar35;
      uVar35 = (ulong)CARRY8(uVar64,uVar35);
      uVar59 = uVar55 + uVar46;
      uVar64 = uVar59 + uVar35;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_4e8.d[1];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = psStack_488;
      uVar61 = SUB168(auVar9 * auVar25,8);
      uVar54 = SUB168(auVar9 * auVar25,0);
      uVar43 = uVar42 + uVar54;
      uVar54 = (ulong)CARRY8(uVar42,uVar54);
      uVar60 = uVar64 + uVar61;
      uVar56 = uVar60 + uVar54;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_4e8.d[2];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_490;
      uVar62 = SUB168(auVar10 * auVar26,8);
      uVar42 = SUB168(auVar10 * auVar26,0);
      uVar45 = uVar43 + uVar42;
      uVar42 = (ulong)CARRY8(uVar43,uVar42);
      uVar44 = uVar56 + uVar62;
      uVar57 = uVar44 + uVar42;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_4e8.d[3];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_498;
      uVar63 = SUB168(auVar11 * auVar27,8);
      uVar43 = SUB168(auVar11 * auVar27,0);
      local_478.d[3] = uVar45 + uVar43;
      uVar43 = (ulong)CARRY8(uVar45,uVar43);
      uVar45 = uVar57 + uVar63;
      uVar58 = uVar45 + uVar43;
      uVar61 = (ulong)(CARRY8(uVar55,uVar46) || CARRY8(uVar59,uVar35)) +
               (ulong)(CARRY8(uVar64,uVar61) || CARRY8(uVar60,uVar54)) +
               (ulong)(CARRY8(uVar56,uVar62) || CARRY8(uVar44,uVar42)) +
               (ulong)(CARRY8(uVar57,uVar63) || CARRY8(uVar45,uVar43));
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_4e8.d[1];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_480;
      uVar44 = SUB168(auVar12 * auVar28,8);
      uVar35 = SUB168(auVar12 * auVar28,0);
      uVar42 = uVar58 + uVar35;
      uVar35 = (ulong)CARRY8(uVar58,uVar35);
      uVar43 = uVar61 + uVar44;
      uVar62 = uVar43 + uVar35;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_4e8.d[2];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = psStack_488;
      uVar45 = SUB168(auVar13 * auVar29,8);
      uVar54 = SUB168(auVar13 * auVar29,0);
      uVar60 = uVar42 + uVar54;
      uVar54 = (ulong)CARRY8(uVar42,uVar54);
      uVar59 = uVar62 + uVar45;
      uVar63 = uVar59 + uVar54;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_4e8.d[3];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_490;
      uVar46 = SUB168(auVar14 * auVar30,8);
      uVar42 = SUB168(auVar14 * auVar30,0);
      local_458 = uVar60 + uVar42;
      uVar42 = (ulong)CARRY8(uVar60,uVar42);
      uVar60 = uVar63 + uVar46;
      uVar55 = uVar60 + uVar42;
      uVar44 = (ulong)(CARRY8(uVar61,uVar44) || CARRY8(uVar43,uVar35)) +
               (ulong)(CARRY8(uVar62,uVar45) || CARRY8(uVar59,uVar54)) +
               (ulong)(CARRY8(uVar63,uVar46) || CARRY8(uVar60,uVar42));
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_4e8.d[2];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_480;
      uVar59 = SUB168(auVar15 * auVar31,8);
      uVar35 = SUB168(auVar15 * auVar31,0);
      uVar43 = uVar55 + uVar35;
      uVar35 = (ulong)CARRY8(uVar55,uVar35);
      uVar42 = uVar44 + uVar59;
      uVar45 = uVar42 + uVar35;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_4e8.d[3];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = psStack_488;
      uVar60 = SUB168(auVar16 * auVar32,8);
      uVar54 = SUB168(auVar16 * auVar32,0);
      local_450 = uVar43 + uVar54;
      uVar54 = (ulong)CARRY8(uVar43,uVar54);
      uVar43 = uVar45 + uVar60;
      local_448._8_8_ =
           (ulong)(CARRY8(uVar44,uVar59) || CARRY8(uVar42,uVar35)) +
           (ulong)(CARRY8(uVar45,uVar60) || CARRY8(uVar43,uVar54));
      local_448._0_8_ = uVar43 + uVar54;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_4e8.d[3];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_480;
      local_448 = auVar17 * auVar33 + local_448;
      psVar49 = &local_4e8;
      pcStack_520 = (code *)0x158c0d;
      local_4c0 = uVar37;
      secp256k1_scalar_reduce_512(psVar49,local_478.d);
      if ((int)uVar66 < 0) {
        unaff_RBP = (ulong)-uVar66;
        local_4b8.d[1] = 0;
        local_4b8.d[2] = 0;
        local_4b8.d[3] = 0;
        pcStack_520 = (code *)0x158c5a;
        local_4b8.d[0] = unaff_RBP;
        secp256k1_scalar_negate(&local_4b8,&local_4b8);
      }
      else {
        local_4b8.d[1] = 0;
        local_4b8.d[2] = 0;
        local_4b8.d[3] = 0;
        local_4b8.d[0] = unaff_RBP;
      }
      number = &local_4b8;
      pcStack_520 = (code *)0x158c68;
      psVar40 = psVar49;
      secp256k1_scalar_add(psVar49,psVar49,number);
      uVar37 = (ulong)((int)local_4c0 - 1);
      psVar65 = unaff_R12;
      psVar53 = unaff_R13;
      uVar35 = unaff_R15;
    } while (0 < (int)local_4c0);
  }
  local_478.d[0] = (uint64_t)local_518;
  local_478.d[1] = 0;
  local_478.d[2] = 0;
  local_478.d[3] = 0;
  psVar41 = &local_508;
  pcStack_520 = (code *)0x158ca7;
  psVar49 = psVar41;
  psVar40 = psVar41;
  secp256k1_scalar_add(psVar41,psVar41,&local_478);
  psVar65 = unaff_R12;
  psVar53 = unaff_R13;
  uVar35 = unaff_R15;
  if ((((local_4e8.d[0] == local_508.d[0]) && (local_4e8.d[1] == local_508.d[1])) &&
      (local_4e8.d[2] == local_508.d[2])) && (local_4e8.d[3] == local_508.d[3])) {
    return;
  }
LAB_00158cfb:
  pcStack_520 = secp256k1_wnaf_fixed;
  test_constant_wnaf_cold_3();
  uVar37 = (ulong)extraout_EDX;
  psStack_548 = psVar41;
  psStack_540 = psVar65;
  psStack_538 = psVar53;
  psStack_530 = number;
  uStack_528 = uVar35;
  pcStack_520 = (code *)unaff_RBP;
  if (((psVar49->d[1] == 0 && psVar49->d[2] == 0) && psVar49->d[3] == 0) && psVar49->d[0] == 0) {
    uVar37 = (long)(int)(extraout_EDX + 0x7f) / (long)(int)extraout_EDX;
    if ((int)uVar37 < 1) {
      return;
    }
    pcStack_568 = (code *)0x158dd5;
    memset(psVar40,0,(uVar37 & 0xffffffff) << 2);
    return;
  }
  if (extraout_EDX < 0x20) {
    uVar66 = (uint)psVar49->d[0];
    uStack_558 = ~uVar66 & 1;
    bVar39 = (byte)extraout_EDX;
    *(uint *)psVar40->d = (~(uint)(-1L << (bVar39 & 0x3f)) & uVar66) + uStack_558;
    uVar66 = (byte)(((short)extraout_EDX + 0x7fU & 0xff) / (ushort)bVar39) - 1;
    uVar54 = (ulong)uVar66;
    uStack_55c = 0x80 - uVar66 * extraout_EDX;
    uVar35 = uVar54;
    while( true ) {
      uVar66 = extraout_EDX;
      if (uVar35 == uVar54) {
        uVar66 = uStack_55c;
      }
      pcStack_568 = (code *)0x158d95;
      uVar66 = secp256k1_scalar_get_bits_var(psVar49,(int)uVar35 * extraout_EDX,uVar66);
      if (uVar66 != 0) break;
      *(undefined4 *)((long)psVar40->d + uVar35 * 4) = 0;
      bVar68 = (long)uVar35 < 2;
      uVar35 = uVar35 - 1;
      if (bVar68) {
        return;
      }
    }
    if ((long)uVar35 < 1) {
      return;
    }
    iStack_560 = -1 << (bVar39 & 0x1f);
    iStack_554 = 1 << (bVar39 & 0x1f);
    uVar42 = 1;
    psStack_550 = psVar49;
    do {
      uVar66 = extraout_EDX;
      if (uVar54 == uVar42) {
        uVar66 = uStack_55c;
      }
      pcStack_568 = (code *)0x158e27;
      uVar66 = secp256k1_scalar_get_bits_var(psStack_550,(uint)uVar37,uVar66);
      if ((uVar66 & 1) == 0) {
        piVar1 = (int *)((long)psVar40->d + uVar42 * 4 + -4);
        *piVar1 = *piVar1 + iStack_560;
        uVar66 = uVar66 | 1;
      }
      *(uint *)((long)psVar40->d + uVar42 * 4) = uVar66;
      if (1 < uVar42) {
        iVar50 = *(int *)((long)psVar40->d + uVar42 * 4 + -4);
        if (iVar50 == -1) {
          iVar50 = *(int *)((long)psVar40->d + uVar42 * 4 + -8);
          if (0 < iVar50) {
            iVar50 = iVar50 + iStack_560;
            goto LAB_00158e65;
          }
        }
        else if ((iVar50 == 1) &&
                (iVar50 = *(int *)((long)psVar40->d + uVar42 * 4 + -8), iVar50 < 0)) {
          iVar50 = iVar50 + iStack_554;
LAB_00158e65:
          *(int *)((long)psVar40->d + uVar42 * 4 + -8) = iVar50;
          *(undefined4 *)((long)psVar40->d + uVar42 * 4 + -4) = 0;
        }
      }
      uVar42 = uVar42 + 1;
      uVar37 = (ulong)((uint)uVar37 + extraout_EDX);
      if ((int)uVar35 + 1 == uVar42) {
        return;
      }
    } while( true );
  }
  pcStack_568 = test_fixed_wnaf_small_helper;
  psVar41 = psVar40;
  secp256k1_wnaf_fixed_cold_1();
  uVar54 = 0x20;
  do {
    uVar66 = (int)uVar54 - 1;
    uVar54 = (ulong)uVar66;
    if (*(int *)((long)psVar41->d + uVar54 * 4) != 0) {
      pcStack_570 = (code *)0x158ec8;
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_00158ec8;
    }
  } while (8 < uVar66);
  uVar66 = 7;
  while (*(int *)((long)psVar41->d + (ulong)uVar66 * 4) ==
         *(int *)((long)psVar49->d + (ulong)uVar66 * 4)) {
    bVar68 = uVar66 == 0;
    uVar66 = uVar66 - 1;
    if (bVar68) {
      return;
    }
  }
LAB_00158ec8:
  pcStack_570 = test_ecmult_target;
  test_fixed_wnaf_small_helper_cold_2();
  psVar67 = (secp256k1_gej *)auStack_1190;
  psVar48 = (secp256k1_strauss_point_state *)((ulong)psVar49 & 0xffffffff);
  a = (secp256k1_scalar *)auStack_1170;
  psStack_1198 = (secp256k1_strauss_point_state *)0x158ef0;
  psStack_598 = psVar40;
  psStack_590 = psVar65;
  psStack_588 = psVar53;
  uStack_580 = uVar37;
  uStack_578 = uVar35;
  pcStack_570 = (code *)unaff_RBP;
  random_scalar_order_test(a);
  psStack_1198 = (secp256k1_strauss_point_state *)0x158f01;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_1190,a,psVar41);
  psStack_1198 = (secp256k1_strauss_point_state *)0x158f0c;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_1190,(secp256k1_scalar *)auStack_1190);
  if ((int)psVar49 == 0) {
    psStack_1198 = (secp256k1_strauss_point_state *)0x159005;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1008,(secp256k1_scalar *)auStack_1170);
    psStack_1198 = (secp256k1_strauss_point_state *)0x15901c;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_10a0,(secp256k1_scalar *)auStack_1190);
    psStack_1198 = (secp256k1_strauss_point_state *)0x159030;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1138,psVar41);
  }
  else {
    psStack_1198 = (secp256k1_strauss_point_state *)0x158f24;
    random_group_element_test(&sStack_f70);
    psStack_1198 = (secp256k1_strauss_point_state *)0x158f34;
    secp256k1_gej_set_ge(&sStack_f08,&sStack_f70);
    if ((int)psVar49 == 1) {
      psVar65 = asStack_e70;
      psVar53 = asStack_cf0;
      psVar48 = &sStack_9b0;
      a = &test_ecmult_target::zero;
      psStack_1198 = (secp256k1_strauss_point_state *)0x158f94;
      sStack_10a0.x.n[0] = (uint64_t)psVar65;
      sStack_10a0.x.n[1] = (uint64_t)psVar53;
      sStack_10a0.x.n[2] = (uint64_t)psVar48;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_10a0,&sStack_1008,1,&sStack_f08,
                 (secp256k1_scalar *)auStack_1170,&test_ecmult_target::zero);
      psStack_1198 = (secp256k1_strauss_point_state *)0x158fbf;
      sStack_1138.x.n[0] = (uint64_t)psVar65;
      sStack_1138.x.n[1] = (uint64_t)psVar53;
      sStack_1138.x.n[2] = (uint64_t)psVar48;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_1138,&sStack_10a0,1,&sStack_f08,
                 (secp256k1_scalar *)auStack_1190,&test_ecmult_target::zero);
      psStack_1198 = (secp256k1_strauss_point_state *)0x158fe7;
      auStack_1170._32_8_ = psVar65;
      psStack_1148 = psVar53;
      psStack_1140 = psVar48;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(auStack_1170 + 0x20),&sStack_1138,1,&sStack_f08,psVar41
                 ,&test_ecmult_target::zero);
      psVar67 = &sStack_f08;
    }
    else {
      a = (secp256k1_scalar *)&sStack_f70;
      psStack_1198 = (secp256k1_strauss_point_state *)0x15904f;
      secp256k1_ecmult_const(&sStack_1008,(secp256k1_ge *)a,(secp256k1_scalar *)auStack_1170);
      psStack_1198 = (secp256k1_strauss_point_state *)0x159062;
      secp256k1_ecmult_const(&sStack_10a0,(secp256k1_ge *)a,(secp256k1_scalar *)auStack_1190);
      psStack_1198 = (secp256k1_strauss_point_state *)0x159072;
      secp256k1_ecmult_const(&sStack_1138,(secp256k1_ge *)a,psVar41);
      psVar67 = (secp256k1_gej *)auStack_1190;
    }
  }
  psStack_1198 = (secp256k1_strauss_point_state *)0x15908c;
  secp256k1_gej_add_var(&sStack_1138,&sStack_1138,&sStack_1008,(secp256k1_fe *)0x0);
  psStack_1198 = (secp256k1_strauss_point_state *)0x1590a1;
  psVar51 = &sStack_1138;
  secp256k1_gej_add_var(&sStack_1138,&sStack_1138,&sStack_10a0,(secp256k1_fe *)0x0);
  psStack_1198 = (secp256k1_strauss_point_state *)0x1590a9;
  psVar52 = &sStack_1138;
  secp256k1_gej_verify(&sStack_1138);
  if (sStack_1138.infinity != 0) {
    return;
  }
  psStack_1198 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  psVar49 = (secp256k1_scalar *)((ulong)psVar52 & 0xffffffff);
  psStack_1300 = (secp256k1_scalar *)0x1590f7;
  psStack_12e8 = psVar51;
  lStack_12e0 = extraout_RDX;
  psStack_11c0 = &sStack_1138;
  psStack_11b8 = psVar65;
  psStack_11b0 = psVar53;
  psStack_11a8 = (secp256k1_ge *)a;
  psStack_11a0 = psVar67;
  psStack_1198 = psVar48;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_12ee = SUB84(psVar52,0);
  acc = &sStack_1228;
  sStack_1228.s[0] = 0x6a09e667;
  sStack_1228.s[1] = 0xbb67ae85;
  sStack_1228.s[2] = 0x3c6ef372;
  sStack_1228.s[3] = 0xa54ff53a;
  sStack_1228.s[4] = 0x510e527f;
  sStack_1228.s[5] = 0x9b05688c;
  sStack_1228.s[6] = 0x1f83d9ab;
  sStack_1228.s[7] = 0x5be0cd19;
  psVar51 = (secp256k1_gej *)0x0;
  sStack_1228.bytes = 0;
  sStack_12b8.d[0] = 0;
  sStack_12b8.d[1] = 0;
  sStack_12b8.d[2] = 0;
  sStack_12b8.d[3] = 0;
  psStack_1300 = (secp256k1_scalar *)0x159147;
  test_ecmult_accumulate(acc,&sStack_12b8,scratch);
  sStack_12b8.d[0] = 1;
  sStack_12b8.d[1] = 0;
  sStack_12b8.d[2] = 0;
  sStack_12b8.d[3] = 0;
  psStack_1300 = (secp256k1_scalar *)0x159169;
  test_ecmult_accumulate(acc,&sStack_12b8,scratch);
  psStack_1300 = (secp256k1_scalar *)0x159174;
  secp256k1_scalar_negate(&sStack_12b8,&sStack_12b8);
  psStack_1300 = (secp256k1_scalar *)0x159185;
  test_ecmult_accumulate(acc,&sStack_12b8,scratch);
  psVar67 = psStack_12e8;
  if (psStack_12e8 != (secp256k1_gej *)0x0) {
    psVar51 = (secp256k1_gej *)0x0;
    acc = &sStack_1298;
    psVar49 = &sStack_12d8;
    do {
      uStack_12ea = SUB82(psVar51,0);
      sStack_1298.s[0] = 0x6a09e667;
      sStack_1298.s[1] = 0xbb67ae85;
      sStack_1298.s[2] = 0x3c6ef372;
      sStack_1298.s[3] = 0xa54ff53a;
      sStack_1298.s[4] = 0x510e527f;
      sStack_1298.s[5] = 0x9b05688c;
      sStack_1298.s[6] = 0x1f83d9ab;
      sStack_1298.s[7] = 0x5be0cd19;
      sStack_1298.bytes = 0;
      psStack_1300 = (secp256k1_scalar *)0x1591e1;
      secp256k1_sha256_write(acc,(uchar *)&uStack_12ee,6);
      psStack_1300 = (secp256k1_scalar *)0x1591ec;
      secp256k1_sha256_finalize(acc,(uchar *)psVar49);
      psStack_1300 = (secp256k1_scalar *)0x1591f9;
      secp256k1_scalar_set_b32(&sStack_12b8,(uchar *)psVar49,(int *)0x0);
      psStack_1300 = (secp256k1_scalar *)0x15920c;
      test_ecmult_accumulate(&sStack_1228,&sStack_12b8,scratch);
      psVar51 = (secp256k1_gej *)((long)(psVar51->x).n + 1);
    } while (psVar67 != psVar51);
  }
  hash = &sStack_1228;
  psVar40 = &sStack_12d8;
  psStack_1300 = (secp256k1_scalar *)0x159226;
  secp256k1_sha256_finalize(hash,(uchar *)psVar40);
  lVar36 = 0;
  while (*(char *)((long)sStack_12d8.d + lVar36) == *(char *)(lStack_12e0 + lVar36)) {
    lVar36 = lVar36 + 1;
    if (lVar36 == 0x20) {
      psStack_1300 = (secp256k1_scalar *)0x15924e;
      secp256k1_scratch_space_destroy(CTX,scratch);
      return;
    }
  }
  psStack_1300 = (secp256k1_scalar *)test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_1308 = psVar67;
  sStack_1f80.d[2] = 0;
  sStack_1f80.d[3] = 0;
  sStack_1f80.d[0] = 0;
  sStack_1f80.d[1] = 0;
  sStack_1fd8 = 0x41;
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x1592b0;
  psStack_1328 = scratch;
  psStack_1320 = acc;
  psStack_1318 = &sStack_12b8;
  psStack_1310 = psVar51;
  psStack_1300 = psVar49;
  secp256k1_gej_set_ge(&sStack_1e60,&secp256k1_ge_const_g);
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x1592bd;
  secp256k1_gej_set_infinity(&sStack_1ef8);
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x1592d4;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1c98,psVar40);
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x15931f;
  sStack_1dc8.x.n[0] = (uint64_t)asStack_1c00;
  sStack_1dc8.x.n[1] = (uint64_t)asStack_1a80;
  sStack_1dc8.x.n[2] = (uint64_t)&sStack_1740;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1dc8,&sStack_1d30,1,&sStack_1e60,psVar40,
             &sStack_1f80);
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x159355;
  sStack_1f60.x.n[0] = (uint64_t)asStack_1c00;
  sStack_1f60.x.n[1] = (uint64_t)asStack_1a80;
  sStack_1f60.x.n[2] = (uint64_t)&sStack_1740;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1f60,&sStack_1dc8,1,&sStack_1ef8,&sStack_1f80,
             psVar40);
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x15937b;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch_00,(secp256k1_gej *)&sStack_1740,psVar40,
             (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  cb = test_ecmult_accumulate_cb;
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x1593a5;
  psVar49 = psVar40;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch_00,asStack_1a80,&sStack_1f80,
             test_ecmult_accumulate_cb,psVar40,1);
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x1593bf;
  secp256k1_ecmult_const(asStack_1c00,&secp256k1_ge_const_g,psVar40);
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x1593d7;
  secp256k1_ge_set_gej_var(&sStack_1f60,&sStack_1c98);
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x1593e7;
  ge_equals_gej(&sStack_1f60,&sStack_1d30);
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x1593f2;
  ge_equals_gej(&sStack_1f60,&sStack_1dc8);
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x1593fd;
  ge_equals_gej(&sStack_1f60,(secp256k1_gej *)&sStack_1740);
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x159408;
  ge_equals_gej(&sStack_1f60,asStack_1a80);
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x159413;
  ge_equals_gej(&sStack_1f60,asStack_1c00);
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x15941b;
  secp256k1_ge_verify(&sStack_1f60);
  if (sStack_1f60.infinity == 0) {
    psVar53 = &sStack_1f60;
    scratch_01 = asStack_1fd0;
    psVar40 = (secp256k1_scalar *)0x0;
    psStack_1ff8 = (secp256k1_strauss_point_state *)0x159457;
    secp256k1_eckey_pubkey_serialize(psVar53,scratch_01->magic,&sStack_1fd8,0);
    if (sStack_1fd8 != 0x41) {
      psStack_1ff8 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
      test_ecmult_accumulate_cold_1();
      psStack_2020 = &sStack_1fd8;
      psStack_2018 = asStack_1c00;
      psStack_2010 = &sStack_1f80;
      psStack_2008 = hash;
      psStack_2000 = &sStack_1dc8;
      psStack_1ff8 = &sStack_1740;
      secp256k1_gej_set_infinity(r);
      if (psVar40 != (secp256k1_scalar *)0x0 || sStack_1fe8 != 0) {
        if (sStack_1fe8 == 0) {
          sStack_2910.aux = asStack_24e8;
          sStack_2910.pre_a = asStack_2368;
          sStack_2910.ps = &sStack_28f8;
          secp256k1_ecmult_strauss_wnaf(&sStack_2910,r,1,r,&secp256k1_scalar_zero,psVar40);
        }
        else {
          if ((scratch_01 == (secp256k1_scratch *)0x0) ||
             (sVar47 = secp256k1_pippenger_max_points((secp256k1_callback *)psVar53,scratch_01),
             sVar47 == 0)) {
LAB_001596b0:
            secp256k1_ecmult_multi_simple_var(r,psVar40,cb,psVar49,sStack_1fe8);
            return;
          }
          uVar37 = 5000000;
          if (sVar47 < 5000000) {
            uVar37 = sVar47;
          }
          uVar35 = sStack_1fe8 - 1;
          uStack_2918 = uVar35 / uVar37 + 1;
          uVar37 = uVar35 / uStack_2918;
          if (uVar37 < 0x57) {
            lVar36 = 0;
            do {
              if (scratch_01->magic[lVar36] != "scratch"[lVar36]) {
                (*(code *)(psVar53->x).n[0])("invalid scratch space",(psVar53->x).n[1]);
                goto LAB_001596b0;
              }
              lVar36 = lVar36 + 1;
            } while (lVar36 != 8);
            uVar54 = scratch_01->max_size - scratch_01->alloc_size;
            uVar37 = 0;
            if (0x4a < uVar54) {
              uVar37 = uVar54 - 0x4b;
            }
            if (uVar37 < 0x988) goto LAB_001596b0;
            uVar37 = uVar37 / 0x988;
            if (4999999 < uVar37) {
              uVar37 = 5000000;
            }
            uStack_2918 = uVar35 / uVar37 + 1;
            uVar37 = uVar35 / uStack_2918;
            pcVar38 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar38 = secp256k1_ecmult_pippenger_batch;
          }
          uVar37 = uVar37 + 1;
          lVar36 = 0;
          uVar35 = 0;
          do {
            uVar54 = uVar37;
            if (sStack_1fe8 < uVar37) {
              uVar54 = sStack_1fe8;
            }
            psVar41 = (secp256k1_scalar *)0x0;
            if (uVar35 == 0) {
              psVar41 = psVar40;
            }
            iVar50 = (*pcVar38)(psVar53,scratch_01,&sStack_28f8,psVar41,cb,psVar49,uVar54,lVar36);
            if (iVar50 == 0) {
              return;
            }
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_28f8,(secp256k1_fe *)0x0);
            sStack_1fe8 = sStack_1fe8 - uVar54;
            uVar35 = uVar35 + 1;
            lVar36 = lVar36 + uVar37;
          } while (uStack_2918 != uVar35);
        }
      }
      return;
    }
    sVar47 = 0x41;
  }
  else {
    asStack_1fd0[0].magic[0] = '\0';
    sVar47 = 1;
  }
  psStack_1ff8 = (secp256k1_strauss_point_state *)0x15946f;
  secp256k1_sha256_write(hash,asStack_1fd0[0].magic,sVar47);
  return;
}

Assistant:

static void test_constant_wnaf(const secp256k1_scalar *number, int w) {
    secp256k1_scalar x, shift;
    int wnaf[256] = {0};
    int i;
    int skew;
    int bits = 256;
    secp256k1_scalar num = *number;
    secp256k1_scalar scalar_skew;

    secp256k1_scalar_set_int(&x, 0);
    secp256k1_scalar_set_int(&shift, 1 << w);
    for (i = 0; i < 16; ++i) {
        secp256k1_scalar_shr_int(&num, 8);
    }
    bits = 128;
    skew = secp256k1_wnaf_const(wnaf, &num, w, bits);

    for (i = WNAF_SIZE_BITS(bits, w); i >= 0; --i) {
        secp256k1_scalar t;
        int v = wnaf[i];
        CHECK(v != 0); /* check nonzero */
        CHECK(v & 1);  /* check parity */
        CHECK(v > -(1 << w)); /* check range above */
        CHECK(v < (1 << w));  /* check range below */

        secp256k1_scalar_mul(&x, &x, &shift);
        if (v >= 0) {
            secp256k1_scalar_set_int(&t, v);
        } else {
            secp256k1_scalar_set_int(&t, -v);
            secp256k1_scalar_negate(&t, &t);
        }
        secp256k1_scalar_add(&x, &x, &t);
    }
    /* Skew num because when encoding numbers as odd we use an offset */
    secp256k1_scalar_set_int(&scalar_skew, skew);
    secp256k1_scalar_add(&num, &num, &scalar_skew);
    CHECK(secp256k1_scalar_eq(&x, &num));
}